

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingTermsAddOne(Fts3Table *p,int iCol,int iPos,Fts3Hash *pHash,char *zToken,int nToken)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  void *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void *in_RDI;
  int *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int rc;
  PendingList *pList;
  int in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  int *piVar5;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  piVar3 = (int *)sqlite3Fts3HashFind((Fts3Hash *)CONCAT44(in_R9D,in_stack_ffffffffffffffc0),
                                      in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  if (piVar3 != (int *)0x0) {
    *(int *)((long)in_RDI + 0x1fc) = *(int *)((long)in_RDI + 0x1fc) - (*piVar3 + in_R9D + 0x28);
  }
  iVar2 = fts3PendingListAppend
                    ((PendingList **)CONCAT44(iVar6,in_stack_ffffffffffffffe8),(sqlite3_int64)in_RDI
                     ,CONCAT44(in_ESI,in_EDX),(sqlite3_int64)in_RCX,in_R8);
  if ((iVar2 != 0) &&
     (piVar5 = piVar3,
     piVar4 = (int *)sqlite3Fts3HashInsert
                               ((Fts3Hash *)CONCAT44(iVar6,in_stack_ffffffffffffffe8),in_RDI,in_ESI,
                                in_RCX), piVar5 == piVar4)) {
    sqlite3_free((void *)0x257a2f);
    iVar6 = 7;
  }
  if (iVar6 == 0) {
    *(int *)((long)in_RDI + 0x1fc) = *(int *)((long)in_RDI + 0x1fc) + *piVar3 + in_R9D + 0x28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts3PendingTermsAddOne(
  Fts3Table *p,
  int iCol,
  int iPos,
  Fts3Hash *pHash,                /* Pending terms hash table to add entry to */
  const char *zToken,
  int nToken
){
  PendingList *pList;
  int rc = SQLITE_OK;

  pList = (PendingList *)fts3HashFind(pHash, zToken, nToken);
  if( pList ){
    p->nPendingData -= (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  if( fts3PendingListAppend(&pList, p->iPrevDocid, iCol, iPos, &rc) ){
    if( pList==fts3HashInsert(pHash, zToken, nToken, pList) ){
      /* Malloc failed while inserting the new entry. This can only
      ** happen if there was no previous entry for this token.
      */
      assert( 0==fts3HashFind(pHash, zToken, nToken) );
      sqlite3_free(pList);
      rc = SQLITE_NOMEM;
    }
  }
  if( rc==SQLITE_OK ){
    p->nPendingData += (pList->nData + nToken + sizeof(Fts3HashElem));
  }
  return rc;
}